

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O0

bool __thiscall PriorityBranchGroup::finished(PriorityBranchGroup *this)

{
  int iVar1;
  uint uVar2;
  Branching **ppBVar3;
  long in_RDI;
  Tint *unaff_retaddr;
  uint i;
  uint local_14;
  int in_stack_fffffffffffffffc;
  
  iVar1 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x20));
  if (iVar1 == 0) {
    for (local_14 = 0; uVar2 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x38)),
        local_14 < uVar2; local_14 = local_14 + 1) {
      ppBVar3 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_14);
      uVar2 = (**(*ppBVar3)->_vptr_Branching)();
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    Tint::operator=(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  return true;
}

Assistant:

bool PriorityBranchGroup::finished() {
	if (fin != 0) {
		return true;
	}
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (!annotations[i]->finished()) {
			return false;
		}
	}
	fin = 1;
	return true;
}